

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

map_index_t __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
BucketNumber(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,ViewType k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  map_index_t mVar5;
  MixingHashState MVar6;
  void *pvVar7;
  uchar *first;
  uint uVar8;
  size_t sVar9;
  uchar *puVar10;
  ulong uVar11;
  uchar *bytes;
  uint64_t v;
  VariantKey key;
  
  first = (uchar *)k._M_str;
  sVar9 = k._M_len;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                 (ulong)(this->super_UntypedMapBase).seed_;
  MVar6 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)
                     (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0)),first,sVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = MVar6.state_ + sVar9;
  uVar8 = (this->super_UntypedMapBase).num_buckets_ - 1 &
          (SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
          SUB164(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
  puVar10 = "";
  if (first != (uchar *)0x0) {
    puVar10 = first;
  }
  key.integral = sVar9;
  key.data = (char *)puVar10;
  mVar5 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,key);
  if (uVar8 == mVar5) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed +
                   (ulong)(this->super_UntypedMapBase).seed_;
    MVar6 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)
                       (SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar3 * ZEXT816(0x9ddfea08eb382d69),0)),first,sVar9);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = MVar6.state_ + sVar9;
    return (SUB164(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB164(auVar4 * ZEXT816(0x9ddfea08eb382d69),8)) &
           (this->super_UntypedMapBase).num_buckets_ - 1;
  }
  uVar11 = (ulong)uVar8;
  sVar9 = (size_t)mVar5;
  KeyMapBase<std::__cxx11::string>::BucketNumber();
  if ((sVar9 & 7) != 0) {
    protobuf_assumption_failed
              ("node_size % sizeof(NodeBase) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map.h"
               ,0x2a0);
  }
  if (*(Arena **)(uVar11 + 0x18) != (Arena *)0x0) {
    pvVar7 = Arena::AllocateForArray(*(Arena **)(uVar11 + 0x18),sVar9);
    return (map_index_t)pvVar7;
  }
  pvVar7 = operator_new(sVar9);
  return (map_index_t)pvVar7;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }